

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_typical_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float *pfVar1;
  unsigned_long uVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  void *pvVar3;
  undefined1 auVar4 [16];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  unsigned_long uVar5;
  llama_token_data *__args;
  ulong uVar6;
  unsigned_long *puVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_00;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<llama_token_data,_std::allocator<llama_token_data>_> cur_p_new;
  vector<float,_std::allocator<float>_> shifted_scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  void *local_88;
  iterator iStack_80;
  llama_token_data *local_78;
  void *local_68;
  iterator iStack_60;
  float *local_58;
  float local_50;
  undefined4 uStack_4c;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  pointer local_40;
  float local_34;
  
  pfVar1 = (float *)smpl->ctx;
  if (1.0 <= *pfVar1) {
    return;
  }
  llama_sampler_softmax_impl(cur_p);
  if (cur_p->size != 0) {
    fVar13 = 0.0;
    lVar9 = 8;
    uVar10 = 0;
    do {
      local_34 = *(float *)((long)&cur_p->data->id + lVar9);
      fVar11 = logf(local_34);
      fVar13 = fVar13 - fVar11 * local_34;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0xc;
    } while (uVar10 < cur_p->size);
    local_68 = (void *)0x0;
    iStack_60._M_current = (float *)0x0;
    local_58 = (float *)0x0;
    if (cur_p->size != 0) {
      lVar9 = 8;
      uVar6 = 0;
      do {
        fVar11 = logf(*(float *)((long)&cur_p->data->id + lVar9));
        local_50 = ABS(-fVar11 - fVar13);
        if (iStack_60._M_current == local_58) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&local_68,iStack_60,&local_50);
        }
        else {
          *iStack_60._M_current = local_50;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        uVar6 = uVar6 + 1;
        uVar10 = cur_p->size;
        lVar9 = lVar9 + 0xc;
      } while (uVar6 < uVar10);
      goto LAB_0020cdd0;
    }
  }
  local_58 = (float *)0x0;
  iStack_60._M_current = (float *)0x0;
  local_68 = (void *)0x0;
  uVar10 = 0;
LAB_0020cdd0:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,uVar10,
             (allocator_type *)&local_88);
  __last._M_current = local_48._M_current;
  auVar4 = _DAT_002350d0;
  __first._M_current._4_4_ = uStack_4c;
  __first._M_current._0_4_ = local_50;
  if (__first._M_current != local_48._M_current) {
    lVar9 = (long)local_48._M_current - (long)__first._M_current;
    uVar10 = lVar9 - 8;
    auVar15._8_4_ = (int)uVar10;
    auVar15._0_8_ = uVar10;
    auVar15._12_4_ = (int)(uVar10 >> 0x20);
    auVar12._0_8_ = uVar10 >> 3;
    auVar12._8_8_ = auVar15._8_8_ >> 3;
    uVar5 = 0;
    auVar12 = auVar12 ^ _DAT_002350d0;
    auVar14 = _DAT_002350c0;
    do {
      auVar15 = auVar14 ^ auVar4;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        __first._M_current[uVar5] = uVar5;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        __first._M_current[uVar5 + 1] = uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar8 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar8 + 2;
    } while (((uVar10 >> 3) + 2 & 0xfffffffffffffffe) != uVar5);
    lVar8 = 0x3f;
    if (lVar9 >> 3 != 0) {
      for (; (ulong)(lVar9 >> 3) >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>>
              (__first,local_48,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_sampling_cpp:898:47)>
                )&local_68);
    if (lVar9 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_sampling_cpp:898:47)>
                  )&local_68);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_typical_apply(llama_sampler*,llama_token_data_array*)::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_llama_sampling_cpp:898:47)>
                  )&local_68);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        uVar5 = __last_00._M_current[-1];
        uVar2 = *__last_00._M_current;
        fVar13 = *(float *)((long)local_68 + uVar2 * 4);
        fVar11 = *(float *)((long)local_68 + uVar5 * 4);
        puVar7 = __last_00._M_current;
        while (fVar13 < fVar11) {
          *puVar7 = uVar5;
          uVar5 = puVar7[-2];
          puVar7 = puVar7 + -1;
          fVar11 = *(float *)((long)local_68 + uVar5 * 4);
        }
        *puVar7 = uVar2;
      }
    }
  }
  puVar7 = (unsigned_long *)CONCAT44(uStack_4c,local_50);
  lVar9 = (long)local_48._M_current - (long)puVar7 >> 3;
  if (local_48._M_current != puVar7) {
    fVar13 = 0.0;
    uVar10 = 0;
    do {
      fVar13 = fVar13 + cur_p->data[puVar7[uVar10]].p;
      if ((*pfVar1 < fVar13) && (*(long *)(pfVar1 + 2) - 1U <= uVar10)) {
        lVar9 = uVar10 + 1;
        goto LAB_0020cfca;
      }
      uVar10 = uVar10 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != uVar10);
  }
  local_88 = (void *)0x0;
  iStack_80._M_current = (llama_token_data *)0x0;
  local_78 = (llama_token_data *)0x0;
  if (local_48._M_current == puVar7) {
    cur_p->size = 0;
    cur_p->sorted = false;
  }
  else {
LAB_0020cfca:
    local_78 = (llama_token_data *)0x0;
    iStack_80._M_current = (llama_token_data *)0x0;
    local_88 = (void *)0x0;
    lVar8 = 0;
    do {
      __args = cur_p->data + *(long *)(CONCAT44(uStack_4c,local_50) + lVar8 * 8);
      if (iStack_80._M_current == local_78) {
        std::vector<llama_token_data,std::allocator<llama_token_data>>::
        _M_realloc_insert<llama_token_data_const&>
                  ((vector<llama_token_data,std::allocator<llama_token_data>> *)&local_88,iStack_80,
                   __args);
      }
      else {
        (iStack_80._M_current)->p = __args->p;
        fVar13 = __args->logit;
        (iStack_80._M_current)->id = __args->id;
        (iStack_80._M_current)->logit = fVar13;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
    if ((long)iStack_80._M_current - (long)local_88 != 0) {
      memmove(cur_p->data,local_88,(long)iStack_80._M_current - (long)local_88);
    }
    cur_p->size = ((long)iStack_80._M_current - (long)local_88 >> 2) * -0x5555555555555555;
    cur_p->sorted = false;
    if (local_88 != (void *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  pvVar3 = (void *)CONCAT44(uStack_4c,local_50);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_40 - (long)pvVar3);
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

static void llama_sampler_typical_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_typical *) smpl->ctx;

    // Reference implementation:
    // https://github.com/huggingface/transformers/compare/main...cimeister:typical-sampling:typical-pr
    if (ctx->p >= 1.0f) {
        return;
    }

    // Compute the softmax of logits and calculate entropy
    llama_sampler_softmax_impl(cur_p);

    float entropy = 0.0f;
    for (size_t i = 0; i < cur_p->size; ++i) {
        entropy += -cur_p->data[i].p * logf(cur_p->data[i].p);
    }

    // Compute the absolute difference between negative log probability and entropy for each candidate
    std::vector<float> shifted_scores;
    for (size_t i = 0; i < cur_p->size; ++i) {
        float shifted_score = fabsf(-logf(cur_p->data[i].p) - entropy);
        shifted_scores.push_back(shifted_score);
    }

    // Sort tokens based on the shifted_scores and their corresponding indices
    std::vector<size_t> indices(cur_p->size);
    std::iota(indices.begin(), indices.end(), 0);

    std::sort(indices.begin(), indices.end(), [&](size_t a, size_t b) {
        return shifted_scores[a] < shifted_scores[b];
    });

    // Compute the cumulative probabilities
    float cum_sum = 0.0f;
    size_t last_idx = indices.size();

    for (size_t i = 0; i < indices.size(); ++i) {
        size_t idx = indices[i];
        cum_sum += cur_p->data[idx].p;

        // Check if the running sum is greater than typical or if we have kept at least min_keep tokens
        if (cum_sum > ctx->p && i >= ctx->min_keep - 1) {
            last_idx = i + 1;
            break;
        }
    }

    // Resize the output vector to keep only the locally typical tokens
    std::vector<llama_token_data> cur_p_new;
    for (size_t i = 0; i < last_idx; ++i) {
        size_t idx = indices[i];
        cur_p_new.push_back(cur_p->data[idx]);
    }

    // Replace the data in cur_p with the cur_p_new data
    std::copy(cur_p_new.begin(), cur_p_new.end(), cur_p->data);
    cur_p->size = cur_p_new.size();
    cur_p->sorted = false;
}